

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::compiler::Compiler::Node::Content_&> __thiscall
capnp::compiler::Compiler::Node::getContent(Node *this,State minimumState)

{
  CompiledModule *params_1;
  ulong uVar1;
  bool bVar2;
  Which WVar3;
  uint32_t uVar4;
  uint uVar5;
  Content *this_00;
  CompiledModule *params;
  Own<capnp::compiler::Compiler::Node> *__y;
  Own<capnp::compiler::Compiler::Alias> *__y_00;
  Impl *pIVar6;
  Workspace *pWVar7;
  NullableValue<unsigned_long> *pNVar8;
  unsigned_long *puVar9;
  Node *pNVar10;
  size_t sVar11;
  Builder *pBVar12;
  ErrorReporter *pEVar13;
  Orphan<capnp::schema::Node> *params_3;
  Exception *params_1_00;
  NullableValue<kj::Exception> *other;
  Exception *pEVar14;
  Array<capnp::schema::Node::Reader> *other_00;
  Array<capnp::schema::Node::SourceInfo::Reader> *other_01;
  Type *func;
  Iterator IVar15;
  Iterator IVar16;
  ArrayPtr<const_char> AVar17;
  undefined1 local_7b0 [8];
  NodeSet nodeSet;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
  local_748;
  String local_738;
  ArrayPtr<const_char> local_720;
  Content *local_710;
  Workspace *local_708;
  Maybe<kj::Exception> local_700;
  undefined1 local_5a0 [8];
  NullableValue<kj::Exception> exception;
  TemporaryPointer<capnp::schema::Node::NestedNode::Builder> local_438;
  Reader local_410;
  ArrayPtr<const_char> local_3e0;
  TemporaryPointer<capnp::schema::Node::NestedNode::Builder> local_3d0;
  Node *local_3a8;
  Node *node;
  Node **__end3_1;
  Node **__begin3_1;
  Vector<capnp::compiler::Compiler::Node_*> *__range3_1;
  uint local_380;
  undefined1 local_378 [8];
  Iterator nestedIter;
  Builder nestedNodes;
  Node *p;
  undefined1 local_328 [8];
  NullableValue<unsigned_long> lastColon;
  undefined1 local_308 [8];
  NullableValue<unsigned_long> lastDot;
  undefined1 local_2e8 [8];
  BuilderFor<capnp::schema::Node> builder;
  Orphan<capnp::schema::Node> schemaNode;
  Workspace *workspace;
  Fault f_1;
  pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_> local_288;
  Reader local_268;
  ArrayPtr<const_char> local_238;
  undefined1 auStack_228 [8];
  StringPtr name_1;
  Reader local_210;
  Reader local_1e0;
  undefined1 local_1b0 [8];
  Own<capnp::compiler::Compiler::Alias> alias;
  pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_> local_198;
  Reader local_178;
  ArrayPtr<const_char> local_148;
  undefined1 auStack_138 [8];
  StringPtr name;
  Own<capnp::compiler::Compiler::Node> subNode;
  Reader nestedDecl;
  undefined1 local_d8 [8];
  Iterator __end3;
  undefined1 local_b8 [8];
  Iterator __begin3;
  Reader *__range3;
  Arena *arena;
  undefined1 local_60 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:476:3)>
  _kjDefer476;
  Content *content;
  Fault local_28;
  Fault f;
  State minimumState_local;
  Node *this_local;
  
  f.exception._4_4_ = minimumState;
  if (((this->isBuiltin ^ 0xffU) & 1) == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
               ,0x1ce,FAILED,"!isBuiltin","\"illegal method call for built-in declaration\"",
               (char (*) [45])"illegal method call for built-in declaration");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  this_00 = &this->guardedContent;
  bVar2 = Content::stateHasReached(this_00,minimumState);
  if (bVar2) {
    kj::Maybe<capnp::compiler::Compiler::Node::Content_&>::Maybe
              ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&this_local,this_00);
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)this_local;
  }
  if ((this->inGetContent & 1U) != 0) {
    kj::StringPtr::StringPtr
              ((StringPtr *)&_kjDefer476.canceled,"Declaration recursively depends on itself.");
    addError(this,(StringPtr)stack0xffffffffffffffb0);
    kj::Maybe<capnp::compiler::Compiler::Node::Content_&>::Maybe
              ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&this_local,(void *)0x0);
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)this_local;
  }
  this->inGetContent = true;
  arena = (Arena *)this;
  kj::
  defer<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__0>
            ((kj *)local_60,(Type *)&arena);
  switch(this_00->state) {
  case STUB:
    if ((int)f.exception._4_4_ < 1) goto switchD_00923027_default;
    pIVar6 = CompiledModule::getCompiler(this->module);
    params = (CompiledModule *)Compiler::Impl::getNodeArena(pIVar6);
    Declaration::Reader::getNestedDecls((Reader *)&__begin3.index,&this->declaration);
    IVar15 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::begin
                       ((Reader *)&__begin3.index);
    __end3._8_8_ = IVar15.container;
    __begin3.container._0_4_ = IVar15.index;
    local_b8 = (undefined1  [8])__end3._8_8_;
    IVar15 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::end
                       ((Reader *)&__begin3.index);
    local_d8 = (undefined1  [8])IVar15.container;
    __end3.container._0_4_ = IVar15.index;
    while( true ) {
      bVar2 = capnp::_::
              IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
              ::operator!=((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                            *)local_b8,
                           (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                            *)local_d8);
      if (!bVar2) break;
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
      ::operator*((Reader *)&subNode.ptr,
                  (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                   *)local_b8);
      WVar3 = Declaration::Reader::which((Reader *)&subNode.ptr);
      uVar5 = (uint)WVar3;
      if (WVar3 == FILE) {
LAB_00923242:
        kj::Arena::
        allocateOwn<capnp::compiler::Compiler::Node,capnp::compiler::Compiler::Node&,capnp::compiler::Declaration::Reader&>
                  ((Arena *)&name.content.size_,(Node *)params,(Reader *)this);
        Declaration::Reader::getName(&local_178,(Reader *)&subNode.ptr);
        AVar17 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_178);
        name.content.ptr = (char *)AVar17.size_;
        auStack_138 = (undefined1  [8])AVar17.ptr;
        local_148 = AVar17;
        kj::Vector<capnp::compiler::Compiler::Node*>::add<kj::Own<capnp::compiler::Compiler::Node>&>
                  ((Vector<capnp::compiler::Compiler::Node*> *)
                   &(this->guardedContent).orderedNestedNodes,
                   (Own<capnp::compiler::Compiler::Node> *)&name.content.size_);
        __y = kj::mv<kj::Own<capnp::compiler::Compiler::Node>>
                        ((Own<capnp::compiler::Compiler::Node> *)&name.content.size_);
        std::make_pair<kj::StringPtr&,kj::Own<capnp::compiler::Compiler::Node>>
                  (&local_198,(StringPtr *)auStack_138,__y);
        alias.ptr = (Alias *)std::
                             multimap<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>>
                             ::
                             insert<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node>>>
                                       ((multimap<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>>
                                         *)&(this->guardedContent).nestedNodes,&local_198);
        std::pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>::~pair(&local_198);
        kj::Own<capnp::compiler::Compiler::Node>::~Own
                  ((Own<capnp::compiler::Compiler::Node> *)&name.content.size_);
      }
      else if (uVar5 == 1) {
        params_1 = this->module;
        Declaration::Reader::getUsing(&local_210,(Reader *)&subNode.ptr);
        Declaration::Using::Reader::getTarget(&local_1e0,&local_210);
        kj::Arena::
        allocateOwn<capnp::compiler::Compiler::Alias,capnp::compiler::Compiler::CompiledModule&,capnp::compiler::Compiler::Node&,capnp::compiler::Expression::Reader>
                  ((Arena *)local_1b0,params,(Node *)params_1,(Reader *)this);
        Declaration::Reader::getName(&local_268,(Reader *)&subNode.ptr);
        AVar17 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_268);
        name_1.content.ptr = (char *)AVar17.size_;
        auStack_228 = (undefined1  [8])AVar17.ptr;
        local_238 = AVar17;
        __y_00 = kj::mv<kj::Own<capnp::compiler::Compiler::Alias>>
                           ((Own<capnp::compiler::Compiler::Alias> *)local_1b0);
        std::make_pair<kj::StringPtr&,kj::Own<capnp::compiler::Compiler::Alias>>
                  (&local_288,(StringPtr *)auStack_228,__y_00);
        f_1.exception =
             (Exception *)
             std::
             multimap<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>>
             ::insert<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias>>>
                       ((multimap<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>>
                         *)&(this->guardedContent).aliases,&local_288);
        std::pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>::~pair(&local_288);
        kj::Own<capnp::compiler::Compiler::Alias>::~Own
                  ((Own<capnp::compiler::Compiler::Alias> *)local_1b0);
      }
      else {
        if (uVar5 - 2 < 2) goto LAB_00923242;
        if (uVar5 != 4) {
          if (uVar5 == 5) goto LAB_00923242;
          if (2 < uVar5 - 6) {
            if (uVar5 == 9) goto LAB_00923242;
            if (uVar5 != 10) {
              if (uVar5 == 0xb) goto LAB_00923242;
              if (1 < uVar5 - 0xc) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,char_const(&)[25],capnp::compiler::Declaration::Reader&>
                          ((Fault *)&workspace,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                           ,0x205,FAILED,(char *)0x0,"\"unknown declaration type\", nestedDecl",
                           (char (*) [25])"unknown declaration type",(Reader *)&subNode.ptr);
                kj::_::Debug::Fault::fatal((Fault *)&workspace);
              }
            }
          }
        }
      }
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                    *)local_b8);
    }
    Content::advanceState(this_00,EXPANDED);
    break;
  case EXPANDED:
    break;
  case BOOTSTRAP:
    goto switchD_00923027_caseD_2;
  case FINISHED:
    goto switchD_00923027_caseD_3;
  default:
    goto switchD_00923027_default;
  }
  if (1 < (int)f.exception._4_4_) {
    pIVar6 = CompiledModule::getCompiler(this->module);
    pWVar7 = Compiler::Impl::getWorkspace(pIVar6);
    Orphanage::newOrphan<capnp::schema::Node>
              ((Orphan<capnp::schema::Node> *)&builder._builder.dataSize,&pWVar7->orphanage);
    Orphan<capnp::schema::Node>::get
              ((BuilderFor<capnp::schema::Node> *)local_2e8,
               (Orphan<capnp::schema::Node> *)&builder._builder.dataSize);
    capnp::schema::Node::Builder::setId((Builder *)local_2e8,this->id);
    Text::Reader::Reader((Reader *)&lastDot.field_1,&this->displayName);
    capnp::schema::Node::Builder::setDisplayName
              ((Builder *)local_2e8,(Reader)stack0xfffffffffffffd08);
    kj::StringPtr::findLast((StringPtr *)&lastColon.field_1,(char)this + 'P');
    pNVar8 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&lastColon.field_1);
    kj::_::NullableValue<unsigned_long>::NullableValue
              ((NullableValue<unsigned_long> *)local_308,pNVar8);
    kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&lastColon.field_1);
    puVar9 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_308);
    if (puVar9 != (unsigned_long *)0x0) {
      puVar9 = kj::_::NullableValue<unsigned_long>::operator*
                         ((NullableValue<unsigned_long> *)local_308);
      capnp::schema::Node::Builder::setDisplayNamePrefixLength
                ((Builder *)local_2e8,(int)*puVar9 + 1);
    }
    kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_308);
    kj::StringPtr::findLast((StringPtr *)&p,(char)this + 'P');
    pNVar8 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&p);
    kj::_::NullableValue<unsigned_long>::NullableValue
              ((NullableValue<unsigned_long> *)local_328,pNVar8);
    kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&p);
    puVar9 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_328);
    if (puVar9 != (unsigned_long *)0x0) {
      puVar9 = kj::_::NullableValue<unsigned_long>::operator*
                         ((NullableValue<unsigned_long> *)local_328);
      uVar1 = *puVar9;
      uVar4 = capnp::schema::Node::Builder::getDisplayNamePrefixLength((Builder *)local_2e8);
      if (uVar4 < uVar1) {
        puVar9 = kj::_::NullableValue<unsigned_long>::operator*
                           ((NullableValue<unsigned_long> *)local_328);
        capnp::schema::Node::Builder::setDisplayNamePrefixLength
                  ((Builder *)local_2e8,(int)*puVar9 + 1);
      }
    }
    kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_328);
    pNVar10 = kj::_::readMaybe<capnp::compiler::Compiler::Node>(&this->parent);
    if (pNVar10 != (Node *)0x0) {
      capnp::schema::Node::Builder::setScopeId((Builder *)local_2e8,pNVar10->id);
    }
    sVar11 = kj::Vector<capnp::compiler::Compiler::Node_*>::size
                       (&(this->guardedContent).orderedNestedNodes);
    capnp::schema::Node::Builder::initNestedNodes
              ((Builder *)&nestedIter.index,(Builder *)local_2e8,(uint)sVar11);
    IVar16 = List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder::begin
                       ((Builder *)&nestedIter.index);
    __range3_1 = (Vector<capnp::compiler::Compiler::Node_*> *)IVar16.container;
    local_380 = IVar16.index;
    __begin3_1 = (Node **)&(this->guardedContent).orderedNestedNodes;
    local_378 = (undefined1  [8])__range3_1;
    nestedIter.container._0_4_ = local_380;
    __end3_1 = kj::Vector<capnp::compiler::Compiler::Node_*>::begin
                         ((Vector<capnp::compiler::Compiler::Node_*> *)__begin3_1);
    node = (Node *)kj::Vector<capnp::compiler::Compiler::Node_*>::end
                             ((Vector<capnp::compiler::Compiler::Node_*> *)__begin3_1);
    for (; (Node *)__end3_1 != node; __end3_1 = __end3_1 + 1) {
      local_3a8 = *__end3_1;
      capnp::_::
      IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
      ::operator->(&local_3d0,
                   (IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
                    *)local_378);
      pBVar12 = capnp::_::TemporaryPointer<capnp::schema::Node::NestedNode::Builder>::operator->
                          (&local_3d0);
      Declaration::Reader::getName(&local_410,&local_3a8->declaration);
      AVar17 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_410);
      local_3e0 = AVar17;
      capnp::schema::Node::NestedNode::Builder::setName(pBVar12,(Reader)AVar17);
      capnp::_::
      IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
      ::operator->(&local_438,
                   (IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
                    *)local_378);
      pBVar12 = capnp::_::TemporaryPointer<capnp::schema::Node::NestedNode::Builder>::operator->
                          (&local_438);
      capnp::schema::Node::NestedNode::Builder::setId(pBVar12,local_3a8->id);
      capnp::_::
      IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
      ::operator++((IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
                    *)local_378);
    }
    pEVar13 = CompiledModule::getErrorReporter(this->module);
    params_3 = kj::mv<capnp::Orphan<capnp::schema::Node>>
                         ((Orphan<capnp::schema::Node> *)&builder._builder.dataSize);
    pIVar6 = CompiledModule::getCompiler(this->module);
    exception.field_1._343_1_ = Compiler::Impl::shouldCompileAnnotations(pIVar6);
    params_1_00 = (Exception *)
                  kj::Arena::
                  allocate<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
                            (&pWVar7->arena,this,pEVar13,&this->declaration,params_3,
                             (bool *)((long)&exception.field_1 + 0x157));
    (this->guardedContent).translator = (NodeTranslator *)params_1_00;
    local_710 = this_00;
    local_708 = pWVar7;
    kj::
    runCatchingExceptions<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__1>
              (&local_700,(kj *)&local_710,func);
    other = kj::_::readMaybe<kj::Exception>(&local_700);
    kj::_::NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)local_5a0,other);
    kj::Maybe<kj::Exception>::~Maybe(&local_700);
    pEVar14 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_5a0);
    if (pEVar14 != (Exception *)0x0) {
      kj::Maybe<capnp::Schema>::operator=(&(this->guardedContent).bootstrapSchema,(void *)0x0);
      pEVar13 = CompiledModule::getErrorReporter(this->module);
      uVar5 = (*pEVar13->_vptr_ErrorReporter[1])();
      if ((uVar5 & 1) == 0) {
        pEVar14 = kj::_::NullableValue<kj::Exception>::operator*
                            ((NullableValue<kj::Exception> *)local_5a0);
        kj::str<char_const(&)[60],kj::Exception&>
                  (&local_738,(kj *)"Internal compiler bug: Bootstrap schema failed validation:\n",
                   (char (*) [60])pEVar14,params_1_00);
        kj::StringPtr::StringPtr((StringPtr *)&local_720,&local_738);
        addError(this,(StringPtr)local_720);
        kj::String::~String(&local_738);
      }
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_5a0);
    nodeSet.sourceInfo.disposer = (ArrayDisposer *)this_00;
    kj::
    defer<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>
              ((kj *)&local_748,(Type *)&nodeSet.sourceInfo.disposer);
    kj::Arena::
    copy<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
              (&pWVar7->arena,&local_748);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++:578:38)>
    ::~Deferred(&local_748);
    Content::advanceState(this_00,BOOTSTRAP);
    Orphan<capnp::schema::Node>::~Orphan((Orphan<capnp::schema::Node> *)&builder._builder.dataSize);
switchD_00923027_caseD_2:
    if (2 < (int)f.exception._4_4_) {
      NodeTranslator::finish((NodeSet *)local_7b0,(this->guardedContent).translator);
      kj::Maybe<capnp::schema::Node::Reader>::operator=
                (&(this->guardedContent).finalSchema,(Reader *)local_7b0);
      other_00 = kj::mv<kj::Array<capnp::schema::Node::Reader>>
                           ((Array<capnp::schema::Node::Reader> *)&nodeSet.node._reader.nestingLimit
                           );
      kj::Array<capnp::schema::Node::Reader>::operator=(&(this->guardedContent).auxSchemas,other_00)
      ;
      other_01 = kj::mv<kj::Array<capnp::schema::Node::SourceInfo::Reader>>
                           ((Array<capnp::schema::Node::SourceInfo::Reader> *)
                            &nodeSet.auxNodes.disposer);
      kj::Array<capnp::schema::Node::SourceInfo::Reader>::operator=
                (&(this->guardedContent).sourceInfo,other_01);
      Content::advanceState(this_00,FINISHED);
      NodeTranslator::NodeSet::~NodeSet((NodeSet *)local_7b0);
switchD_00923027_caseD_3:
    }
  }
switchD_00923027_default:
  kj::Maybe<capnp::compiler::Compiler::Node::Content_&>::Maybe
            ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&this_local,this_00);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++:476:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:476:3)>
               *)local_60);
  return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)this_local;
}

Assistant:

kj::Maybe<Compiler::Node::Content&> Compiler::Node::getContent(Content::State minimumState) {
  KJ_REQUIRE(!isBuiltin, "illegal method call for built-in declaration");

  auto& content = guardedContent;

  if (content.stateHasReached(minimumState)) {
    return content;
  }

  if (inGetContent) {
    addError("Declaration recursively depends on itself.");
    return nullptr;
  }

  inGetContent = true;
  KJ_DEFER(inGetContent = false);

  switch (content.state) {
    case Content::STUB: {
      if (minimumState <= Content::STUB) break;

      // Expand the child nodes.
      auto& arena = module->getCompiler().getNodeArena();

      for (auto nestedDecl: declaration.getNestedDecls()) {
        switch (nestedDecl.which()) {
          case Declaration::FILE:
          case Declaration::CONST:
          case Declaration::ANNOTATION:
          case Declaration::ENUM:
          case Declaration::STRUCT:
          case Declaration::INTERFACE: {
            kj::Own<Node> subNode = arena.allocateOwn<Node>(*this, nestedDecl);
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.orderedNestedNodes.add(subNode);
            content.nestedNodes.insert(std::make_pair(name, kj::mv(subNode)));
            break;
          }

          case Declaration::USING: {
            kj::Own<Alias> alias = arena.allocateOwn<Alias>(
                *module, *this, nestedDecl.getUsing().getTarget());
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.aliases.insert(std::make_pair(name, kj::mv(alias)));
            break;
          }
          case Declaration::ENUMERANT:
          case Declaration::FIELD:
          case Declaration::UNION:
          case Declaration::GROUP:
          case Declaration::METHOD:
          case Declaration::NAKED_ID:
          case Declaration::NAKED_ANNOTATION:
            // Not a node.  Skip.
            break;
          default:
            KJ_FAIL_ASSERT("unknown declaration type", nestedDecl);
            break;
        }
      }

      content.advanceState(Content::EXPANDED);
    } // fallthrough

    case Content::EXPANDED: {
      if (minimumState <= Content::EXPANDED) break;

      // Construct the NodeTranslator.
      auto& workspace = module->getCompiler().getWorkspace();

      auto schemaNode = workspace.orphanage.newOrphan<schema::Node>();
      auto builder = schemaNode.get();
      builder.setId(id);
      builder.setDisplayName(displayName);
      // TODO(cleanup):  Would be better if we could remember the prefix length from before we
      //   added this decl's name to the end.
      KJ_IF_MAYBE(lastDot, displayName.findLast('.')) {
        builder.setDisplayNamePrefixLength(*lastDot + 1);
      }
      KJ_IF_MAYBE(lastColon, displayName.findLast(':')) {
        if (*lastColon > builder.getDisplayNamePrefixLength()) {
          builder.setDisplayNamePrefixLength(*lastColon + 1);
        }
      }
      KJ_IF_MAYBE(p, parent) {
        builder.setScopeId(p->id);
      }

      auto nestedNodes = builder.initNestedNodes(content.orderedNestedNodes.size());
      auto nestedIter = nestedNodes.begin();
      for (auto node: content.orderedNestedNodes) {
        nestedIter->setName(node->declaration.getName().getValue());
        nestedIter->setId(node->id);
        ++nestedIter;
      }

      content.translator = &workspace.arena.allocate<NodeTranslator>(
          *this, module->getErrorReporter(), declaration, kj::mv(schemaNode),
          module->getCompiler().shouldCompileAnnotations());
      KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&](){
        auto nodeSet = content.translator->getBootstrapNode();
        for (auto& auxNode: nodeSet.auxNodes) {
          workspace.bootstrapLoader.loadOnce(auxNode);
        }
        content.bootstrapSchema = workspace.bootstrapLoader.loadOnce(nodeSet.node);
      })) {
        content.bootstrapSchema = nullptr;
        // Only bother to report validation failures if we think we haven't seen any errors.
        // Otherwise we assume that the errors caused the validation failure.
        if (!module->getErrorReporter().hadErrors()) {
          addError(kj::str("Internal compiler bug: Bootstrap schema failed validation:\n",
                           *exception));
        }
      }

      // If the Workspace is destroyed, revert the node to the EXPANDED state, because the
      // NodeTranslator is no longer valid in this case.
      workspace.arena.copy(kj::defer([&content]() {
        content.bootstrapSchema = nullptr;
        if (content.state > Content::EXPANDED) {
          content.state = Content::EXPANDED;
        }
      }));

      content.advanceState(Content::BOOTSTRAP);
    } // fallthrough

    case Content::BOOTSTRAP: {
      if (minimumState <= Content::BOOTSTRAP) break;

      // Create the final schema.
      auto nodeSet = content.translator->finish();
      content.finalSchema = nodeSet.node;
      content.auxSchemas = kj::mv(nodeSet.auxNodes);
      content.sourceInfo = kj::mv(nodeSet.sourceInfo);

      content.advanceState(Content::FINISHED);
    } // fallthrough

    case Content::FINISHED:
      break;
  }

  return content;
}